

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  iterator local_70;
  const_iterator local_28;
  
  bVar1 = has_relative_path(this);
  if (bVar1) {
    local_28._M_current = (this->_path)._M_dataplus._M_p + (this->_path)._M_string_length;
    iterator::iterator(&local_70,this,&local_28);
    local_70._iter = iterator::decrement(&local_70,&local_70._iter);
    iterator::updateCurrent(&local_70);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_70._current._path._M_dataplus._M_p,
               local_70._current._path._M_dataplus._M_p + local_70._current._path._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
      operator_delete(local_70._current._path._M_dataplus._M_p,
                      local_70._current._path.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::filename() const
{
    return !has_relative_path() ? path() : path(*--end());
}